

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseOffsetExpr(WastParser *this,ExprList *out_expr_list)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_96;
  undefined1 local_95;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  iterator local_58;
  size_type local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  Enum local_2c;
  Enum local_28;
  Enum local_24;
  ExprList *local_20;
  ExprList *out_expr_list_local;
  WastParser *this_local;
  
  local_20 = out_expr_list;
  out_expr_list_local = (ExprList *)this;
  bVar1 = MatchLpar(this,Offset);
  if (bVar1) {
    local_24 = (Enum)ParseTerminatingInstrList(this,local_20);
    bVar1 = Failed((Result)local_24);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    local_28 = (Enum)Expect(this,Rpar);
    bVar1 = Failed((Result)local_28);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  else {
    bVar1 = PeekMatchExpr(this);
    if (!bVar1) {
      local_95 = 1;
      local_80 = &local_78;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,"an offset expr",&local_81);
      local_95 = 0;
      local_58 = &local_78;
      local_50 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_96);
      __l._M_len = local_50;
      __l._M_array = local_58;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,__l,&local_96);
      this_local._4_4_ = ErrorExpected(this,&local_48,"(i32.const 123)");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_96);
      local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
      do {
        local_c8 = local_c8 + -1;
        std::__cxx11::string::~string((string *)local_c8);
      } while (local_c8 != &local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      return (Result)this_local._4_4_;
    }
    local_2c = (Enum)ParseExpr(this,local_20);
    bVar1 = Failed((Result)local_2c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseOffsetExpr(ExprList* out_expr_list) {
  WABT_TRACE(ParseOffsetExpr);
  if (MatchLpar(TokenType::Offset)) {
    CHECK_RESULT(ParseTerminatingInstrList(out_expr_list));
    EXPECT(Rpar);
  } else if (PeekMatchExpr()) {
    CHECK_RESULT(ParseExpr(out_expr_list));
  } else {
    return ErrorExpected({"an offset expr"}, "(i32.const 123)");
  }
  return Result::Ok;
}